

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl.cpp
# Opt level: O3

LiveGLSL * LiveGLSLCreate(Arguments *args)

{
  pointer pcVar1;
  uint32_t uVar2;
  int iVar3;
  LiveGLSL *live_glsl;
  HFileWatcher pvVar4;
  long *plVar5;
  GLFWwindow *handle;
  HGUI pvVar6;
  long *plVar7;
  size_type *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int fb_height;
  string shader_name;
  long *local_e8 [2];
  long local_d8 [2];
  string local_c8;
  string local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  string *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  live_glsl = (LiveGLSL *)operator_new(0xf0);
  local_78 = (string *)&live_glsl->Args;
  memset(live_glsl,0,0xf0);
  (live_glsl->Args).Input._M_dataplus._M_p = (pointer)&(live_glsl->Args).Input.field_2;
  (live_glsl->Args).Input.field_2._M_local_buf[0] = '\0';
  (live_glsl->Args).Output._M_dataplus._M_p = (pointer)&(live_glsl->Args).Output.field_2;
  (live_glsl->Args).Output.field_2._M_local_buf[0] = '\0';
  (live_glsl->Args).Width = 800;
  (live_glsl->Args).Height = 600;
  (live_glsl->Args).EnableIni = true;
  (live_glsl->ShaderPath)._M_dataplus._M_p = (pointer)&(live_glsl->ShaderPath).field_2;
  (live_glsl->ShaderPath).field_2._M_local_buf[0] = '\0';
  (live_glsl->BasePath)._M_dataplus._M_p = (pointer)&(live_glsl->BasePath).field_2;
  (live_glsl->BasePath).field_2._M_local_buf[0] = '\0';
  LOCK();
  (live_glsl->ShaderFileChanged)._M_base._M_i = false;
  UNLOCK();
  pvVar4 = FileWatcherCreate(OnShaderChange,live_glsl,0x10);
  live_glsl->FileWatcher = pvVar4;
  live_glsl->ShaderCompiled = false;
  std::__cxx11::string::_M_assign((string *)&live_glsl->ShaderPath);
  uVar2 = args->Height;
  live_glsl->WindowWidth = args->Width;
  live_glsl->WindowHeight = uVar2;
  live_glsl->IsContinuousRendering = false;
  std::__cxx11::string::_M_assign(local_78);
  std::__cxx11::string::_M_assign((string *)&(live_glsl->Args).Output);
  (live_glsl->Args).EnableIni = args->EnableIni;
  uVar2 = args->Height;
  (live_glsl->Args).Width = args->Width;
  (live_glsl->Args).Height = uVar2;
  ExtractBasePath(&local_a8,&args->Input);
  std::__cxx11::string::operator=((string *)&live_glsl->BasePath,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                    local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((live_glsl->Args).EnableIni == true) {
    ExtractFilenameWithoutExt(&local_a8,&args->Input);
    pcVar1 = (live_glsl->BasePath)._M_dataplus._M_p;
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,pcVar1,pcVar1 + (live_glsl->BasePath)._M_string_length);
    std::__cxx11::string::append((char *)local_e8);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_e8,
                                CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                         (int)local_a8._M_dataplus._M_p));
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8.field_2._8_8_ = plVar5[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    GUIComponentLoad(&local_c8,(vector<GUIComponent,_std::allocator<GUIComponent>_> *)live_glsl);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
        &local_a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                      local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x22006,1);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x2100d,4);
    handle = glfwCreateWindow(live_glsl->WindowWidth,live_glsl->WindowHeight,"live-glsl",
                              (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    live_glsl->GLFWWindowHandle = handle;
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwSetWindowUserPointer(live_glsl->GLFWWindowHandle,live_glsl);
      glfwSetErrorCallback(LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetWindowSizeCallback
                (live_glsl->GLFWWindowHandle,LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetFramebufferSizeCallback
                (live_glsl->GLFWWindowHandle,LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetKeyCallback(live_glsl->GLFWWindowHandle,
                         LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetDropCallback(live_glsl->GLFWWindowHandle,
                          LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetMouseButtonCallback
                (live_glsl->GLFWWindowHandle,LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      local_a8._M_dataplus._M_p._0_4_ = 0;
      local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffff00000000;
      glfwGetFramebufferSize(live_glsl->GLFWWindowHandle,(int *)&local_a8,(int *)&local_c8);
      live_glsl->PixelDensity =
           (float)(int)local_a8._M_dataplus._M_p / (float)live_glsl->WindowWidth;
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      pvVar6 = GUIInit(live_glsl->GLFWWindowHandle,args->Width,args->Height);
      live_glsl->GUI = pvVar6;
      pcVar1 = (args->Input)._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + (args->Input)._M_string_length);
      ReloadShaderIfChanged(live_glsl,&local_50,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      (*glad_glClearColor)(0.21,0.39,0.74,1.0);
      local_88 = 0xbf800000bf800000;
      uStack_80 = 0xbf8000003f800000;
      local_a8.field_2._M_allocated_capacity = 0x3f8000003f800000;
      local_a8.field_2._8_8_ = 0x3f800000bf800000;
      local_a8._M_dataplus._M_p._0_4_ = 0xbf800000;
      local_a8._M_dataplus._M_p._4_4_ = 0x3f800000;
      local_a8._M_string_length._0_4_ = 0x3f800000;
      local_a8._M_string_length._4_4_ = 0xbf800000;
      (*glad_glGenVertexArrays)(1,&live_glsl->VaoId);
      (*glad_glBindVertexArray)(live_glsl->VaoId);
      (*glad_glGenBuffers)(1,&live_glsl->VertexBufferId);
      (*glad_glBindBuffer)(0x8892,live_glsl->VertexBufferId);
      (*glad_glBufferData)(0x8892,0x30,&local_a8,0x88e4);
      return live_glsl;
    }
  }
  glfwTerminate();
  exit(1);
}

Assistant:

LiveGLSL* LiveGLSLCreate(const Arguments& args) {
    LiveGLSL* live_glsl = new LiveGLSL();

    live_glsl->ShaderFileChanged.store(false);
    live_glsl->FileWatcher = FileWatcherCreate(OnShaderChange, live_glsl, 16);
    live_glsl->ShaderCompiled = false;
    live_glsl->ShaderPath = args.Input;
    live_glsl->WindowWidth = args.Width;
    live_glsl->WindowHeight = args.Height;
    live_glsl->IsContinuousRendering = false;
    live_glsl->Args = args;
    live_glsl->BasePath = ExtractBasePath(args.Input);
    
    if (live_glsl->Args.EnableIni) {
        std::string shader_name = ExtractFilenameWithoutExt(args.Input);
        GUIComponentLoad(live_glsl->BasePath + "/" + shader_name + ".ini", live_glsl->GUIComponents);
    }

    // Init GLFW Window
    {
        if (!glfwInit()) {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
        glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
        glfwWindowHint(GLFW_SAMPLES, 4);

        live_glsl->GLFWWindowHandle = glfwCreateWindow(live_glsl->WindowWidth, live_glsl->WindowHeight, "live-glsl", NULL, NULL);
        if (!live_glsl->GLFWWindowHandle) {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwMakeContextCurrent(live_glsl->GLFWWindowHandle);
        glfwSetWindowUserPointer(live_glsl->GLFWWindowHandle, live_glsl);
        glfwSetErrorCallback([](int error, const char* description) {
            fprintf(stderr, "Error: %s\n", description);
        });

        glfwSetWindowSizeCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int width, int height) {
            LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
            live_glsl->WindowWidth = width;
            live_glsl->WindowHeight = height;
        });

        glfwSetFramebufferSizeCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int fb_width, int fb_height) {
            LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
            int window_width = 0;
            int window_height = 0;
            glfwGetWindowSize(live_glsl->GLFWWindowHandle, &window_width, &window_height);
            live_glsl->PixelDensity = (float)fb_width / (float)window_width;
            GUIResize(live_glsl->GUI, window_width, window_height);
        });

        glfwSetKeyCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int key, int scancode, int action, int mods) {
            if (key == GLFW_KEY_ESCAPE) glfwSetWindowShouldClose(window, GL_TRUE);
            GUIKeyCallback(window, key, scancode, action, mods);
        });

        glfwSetDropCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int count, const char** paths) {
            if (count >= 0) {
                LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
                std::string path = std::string(paths[0]);
                live_glsl->ShaderPath = path;
                live_glsl->Args.Input = path;
                live_glsl->BasePath = ExtractBasePath(path);

                ReloadShaderIfChanged(live_glsl, path, true);
            }
        });
        
        glfwSetMouseButtonCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int button, int action, int mods) {
            LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
            GUIMouseButtonCallback(live_glsl->GUI, button, action, mods);
        });

        int fb_width = 0;
        int fb_height = 0;
        glfwGetFramebufferSize(live_glsl->GLFWWindowHandle, &fb_width, &fb_height);
        live_glsl->PixelDensity = (float)fb_width / (float)live_glsl->WindowWidth;
        gladLoadGL(glfwGetProcAddress);
        glfwSwapInterval(1);
    }

    live_glsl->GUI = GUIInit(live_glsl->GLFWWindowHandle, args.Width, args.Height);

    ReloadShaderIfChanged(live_glsl, args.Input, true);

    // Init GL
    {
        glClearColor(0.21, 0.39, 0.74, 1.0);
        const float vertices[] = {
            -1.0f,  1.0f,
             1.0f, -1.0f,
             1.0f,  1.0f,
            -1.0f,  1.0f,
            -1.0f, -1.0f,
             1.0f, -1.0f,
        };

        glGenVertexArrays(1, &live_glsl->VaoId);
        glBindVertexArray(live_glsl->VaoId);
        glGenBuffers(1, &live_glsl->VertexBufferId);
        glBindBuffer(GL_ARRAY_BUFFER, live_glsl->VertexBufferId);
        glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
    }

    return live_glsl;
}